

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::IntEvaluator::tryEvaluateBinaryPred
          (IntEvaluator *this,Interpretation op,Value *arg1,Value *arg2,bool *res)

{
  bool bVar1;
  IntegerConstantType *l;
  int in_ESI;
  undefined8 in_R8;
  IntegerConstantType *unaff_retaddr;
  bool local_1;
  
  l = (IntegerConstantType *)(ulong)(in_ESI - 4);
  switch(l) {
  case (IntegerConstantType *)0x0:
    bVar1 = Kernel::operator>(l,(IntegerConstantType *)0x87a9d5);
    *(bool *)in_R8 = bVar1;
    local_1 = true;
    break;
  case (IntegerConstantType *)0x1:
    bVar1 = operator>=(l,(IntegerConstantType *)0x87a9fa);
    *(bool *)in_R8 = bVar1;
    local_1 = true;
    break;
  case (IntegerConstantType *)0x2:
    bVar1 = Kernel::operator<(l,(IntegerConstantType *)0x87aa1c);
    *(bool *)in_R8 = bVar1;
    local_1 = true;
    break;
  case (IntegerConstantType *)0x3:
    bVar1 = operator<=(l,(IntegerConstantType *)0x87aa3e);
    *(bool *)in_R8 = bVar1;
    local_1 = true;
    break;
  case (IntegerConstantType *)0x4:
    bVar1 = IntegerConstantType::divides((IntegerConstantType *)res,unaff_retaddr);
    *(bool *)in_R8 = bVar1;
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool tryEvaluateBinaryPred(Interpretation op, const Value& arg1,
      const Value& arg2, bool& res)
  {
    switch(op) {
    case Theory::INT_GREATER:
      res = arg1>arg2;
      return true;
    case Theory::INT_GREATER_EQUAL:
      res = arg1>=arg2;
      return true;
    case Theory::INT_LESS:
      res = arg1<arg2;
      return true;
    case Theory::INT_LESS_EQUAL:
      res = arg1<=arg2;
      return true;
    case Theory::INT_DIVIDES:
      res = arg1.divides(arg2);
      return true;
    default:
      return false;
    }
  }